

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

int __thiscall Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint32_t uVar1;
  int iVar2;
  undefined4 in_register_00000034;
  sockaddr local_28;
  
  uVar1 = resolveAddress((char *)CONCAT44(in_register_00000034,__fd));
  if (uVar1 == 0xffffffff) {
    iVar2 = 0;
  }
  else {
    local_28.sa_family = 2;
    local_28.sa_data._2_4_ =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    local_28.sa_data._0_2_ = (ushort)__addr << 8 | (ushort)__addr >> 8;
    iVar2 = ::bind(this->_fd,&local_28,0x10);
    iVar2 = CONCAT31((int3)((uint)iVar2 >> 8),iVar2 != -1);
  }
  return iVar2;
}

Assistant:

bool Socket::bind( const char * addr, uint16_t port )
{
    uint32_t ipaddr = resolveAddress(addr);
    if(ipaddr == 0xFFFFFFFF)
        return false;
    return bind(ipaddr, port);
}